

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis_transcode.cpp
# Opt level: O2

ktx_error_code_e
ktxTexture2_transcodeUastc
          (ktxTexture2 *This,alpha_content_e alphaContent,ktxTexture2 *prototype,
          ktx_transcode_fmt_e outputFormat,ktx_transcode_flags transcodeFlags)

{
  ktx_uint32_t kVar1;
  ktx_uint32_t kVar2;
  ktx_uint8_t *pkVar3;
  ulong uVar4;
  ktxTexture2_private *pkVar5;
  byte bVar6;
  uint uVar7;
  uint32_t orig_width;
  ktx_size_t kVar8;
  ktx_size_t kVar9;
  ktx_uint64_t kVar10;
  ktx_uint64_t kVar11;
  ulong uVar12;
  uint32_t orig_height;
  ktx_error_code_e kVar13;
  ulong uVar14;
  ktx_uint8_t *pOutput_blocks;
  ktx_uint32_t level;
  size_type __new_size;
  uint uVar15;
  uint uVar16;
  bool bVar17;
  basisu_lowlevel_uastc_transcoder uit;
  int local_d0;
  vector<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
  xcoderStates;
  
  if (This->supercompressionScheme == KTX_SS_BASIS_LZ) {
    __assert_fail("This->supercompressionScheme != KTX_SS_BASIS_LZ",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/basis_transcode.cpp"
                  ,0x28f,
                  "ktx_error_code_e ktxTexture2_transcodeUastc(ktxTexture2 *, alpha_content_e, ktxTexture2 *, ktx_transcode_fmt_e, ktx_transcode_flags)"
                 );
  }
  pkVar3 = prototype->pData;
  uVar4 = prototype->dataSize;
  uVar14 = (ulong)((prototype->_protected->_formatSize).blockSizeInBits >> 3);
  pkVar5 = prototype->_private;
  basist::basisu_lowlevel_uastc_transcoder::basisu_lowlevel_uastc_transcoder(&uit);
  xcoderStates.
  super__Vector_base<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  xcoderStates.
  super__Vector_base<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  xcoderStates.
  super__Vector_base<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (This->isVideo == true) {
    __new_size = (size_type)This->numFaces;
  }
  else {
    __new_size = 1;
  }
  std::vector<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>::
  resize(&xcoderStates,__new_size);
  level = This->numLevels;
  uVar12 = 0;
  do {
    level = level - 1;
    if ((int)level < 0) {
      kVar13 = KTX_SUCCESS;
LAB_00151d01:
      std::vector<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
      ::~vector(&xcoderStates);
      return kVar13;
    }
    bVar6 = (byte)level;
    uVar7 = This->baseWidth >> (bVar6 & 0x1f);
    orig_width = uVar7 + (uVar7 == 0);
    uVar7 = This->baseHeight >> (bVar6 & 0x1f);
    orig_height = uVar7 + (uVar7 == 0);
    uVar7 = This->baseDepth >> (bVar6 & 0x1f);
    kVar1 = This->numFaces;
    kVar2 = This->numLayers;
    kVar8 = ktxTexture_calcImageSize((ktxTexture *)This,level,KTX_FORMAT_VERSION_TWO);
    kVar9 = ktxTexture_calcImageSize((ktxTexture *)prototype,level,KTX_FORMAT_VERSION_TWO);
    kVar10 = ktxTexture2_levelDataOffset(This,level);
    uVar15 = kVar1 * kVar2 * (uVar7 + (uVar7 == 0));
    local_d0 = (int)(uVar12 / uVar14);
    kVar11 = uVar15 * kVar9;
    pOutput_blocks = pkVar3 + uVar12;
    uVar7 = 0;
    while (bVar17 = uVar15 != 0, uVar15 = uVar15 - 1, bVar17) {
      uVar16 = 0;
      if (((long)xcoderStates.
                 super__Vector_base<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)xcoderStates.
                super__Vector_base<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x220 != (ulong)(uVar7 + 1)) {
        uVar16 = uVar7 + 1;
      }
      bVar17 = basist::basisu_lowlevel_uastc_transcoder::transcode_image
                         (&uit,outputFormat,pOutput_blocks,(int)(uVar4 / uVar14) - local_d0,
                          This->pData,(uint32_t)This->dataSize,orig_width + 3 >> 2,
                          orig_height + 3 >> 2,orig_width,orig_height,level,(uint32_t)kVar10,
                          (uint32_t)kVar8,transcodeFlags,alphaContent != eNone,This->isVideo,0,
                          xcoderStates.
                          super__Vector_base<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar7,0,-1,-1);
      if (!bVar17) {
        kVar13 = KTX_TRANSCODE_FAILED;
        goto LAB_00151d01;
      }
      kVar10 = (ktx_uint64_t)((uint32_t)kVar10 + (uint32_t)kVar8);
      pOutput_blocks = pOutput_blocks + kVar9;
      uVar7 = uVar16;
    }
    uVar7 = level & 0x7fffffff;
    pkVar5->_levelIndex[uVar7].byteOffset = uVar12;
    pkVar5->_levelIndex[uVar7].byteLength = kVar11;
    pkVar5->_levelIndex[uVar7].uncompressedByteLength = kVar11;
    uVar12 = uVar12 + kVar11;
  } while( true );
}

Assistant:

KTX_error_code
ktxTexture2_transcodeUastc(ktxTexture2* This,
                           alpha_content_e alphaContent,
                           ktxTexture2* prototype,
                           ktx_transcode_fmt_e outputFormat,
                           ktx_transcode_flags transcodeFlags)
{
    assert(This->supercompressionScheme != KTX_SS_BASIS_LZ);

    ktx_uint8_t* pXcodedData = prototype->pData;
    ktx_uint32_t outputBlockByteLength
                      = prototype->_protected->_formatSize.blockSizeInBits / 8;
    ktx_size_t xcodedDataLength
                      = prototype->dataSize / outputBlockByteLength;
    DECLARE_PRIVATE(protoPriv, prototype);
    ktxLevelIndexEntry* protoLevelIndex = protoPriv._levelIndex;
    ktx_size_t levelOffsetWrite = 0;

    basisu_lowlevel_uastc_transcoder uit;
    // See comment on same declaration in transcodeEtc1s.
    std::vector<basisu_transcoder_state> xcoderStates;
    xcoderStates.resize(This->isVideo ? This->numFaces : 1);

    for (ktx_int32_t level = This->numLevels - 1; level >= 0; level--)
    {
        ktx_uint32_t depth;
        uint64_t writeOffset = levelOffsetWrite;
        uint64_t writeOffsetBlocks = levelOffsetWrite / outputBlockByteLength;
        ktx_size_t levelImageSizeIn, levelImageOffsetIn;
        ktx_size_t levelImageSizeOut, levelSizeOut;
        ktx_uint32_t levelImageCount;
        uint32_t levelWidth = MAX(1, This->baseWidth >> level);
        uint32_t levelHeight = MAX(1, This->baseHeight >> level);
        // UASTC texel block dimensions
        const uint32_t bw = 4, bh = 4;
        uint32_t levelBlocksX = (levelWidth + (bw - 1)) / bw;
        uint32_t levelBlocksY = (levelHeight + (bh - 1)) / bh;
        uint32_t stateIndex = 0;

        depth = MAX(1, This->baseDepth  >> level);

        levelImageCount = This->numLayers * This->numFaces * depth;
        levelImageSizeIn = ktxTexture_calcImageSize(ktxTexture(This), level,
                                                    KTX_FORMAT_VERSION_TWO);
        levelImageSizeOut = ktxTexture_calcImageSize(ktxTexture(prototype),
                                                     level,
                                                     KTX_FORMAT_VERSION_TWO);

        levelImageOffsetIn = ktxTexture2_levelDataOffset(This, level);
        levelSizeOut = 0;
        bool status;
        for (uint32_t image = 0; image < levelImageCount; image++) {
            basisu_transcoder_state& xcoderState = xcoderStates[stateIndex];
            // See comment before same lines in transcodeEtc1s.
            if (++stateIndex == xcoderStates.size())
                stateIndex = 0;

            status = uit.transcode_image(
                          (transcoder_texture_format)outputFormat,
                          pXcodedData + writeOffset,
                          (uint32_t)(xcodedDataLength - writeOffsetBlocks),
                          This->pData,
                          (uint32_t)This->dataSize,
                          levelBlocksX,
                          levelBlocksY,
                          levelWidth,
                          levelHeight,
                          level,
                          (uint32_t)levelImageOffsetIn,
                          (uint32_t)levelImageSizeIn,
                          transcodeFlags,
                          alphaContent != eNone,
                          This->isVideo, // is_video
                          //imageDesc.imageFlags ^ cSliceDescFlagsFrameIsIFrame,
                          0, // output_row_pitch_in_blocks_or_pixels
                          &xcoderState, // pState
                          0, // output_rows_in_pixels,
                          -1, // channel0
                          -1  // channel1
                          );
            if (!status)
                return KTX_TRANSCODE_FAILED;
            writeOffset += levelImageSizeOut;
            levelSizeOut += levelImageSizeOut;
            levelImageOffsetIn += levelImageSizeIn;
        }
        protoLevelIndex[level].byteOffset = levelOffsetWrite;
        // writeOffset will be equal to total size of the images in the level.
        protoLevelIndex[level].byteLength = levelSizeOut;
        protoLevelIndex[level].uncompressedByteLength = levelSizeOut;
        levelOffsetWrite += levelSizeOut;
    }
    // In case of transcoding to uncompressed.
    levelOffsetWrite = _KTX_PADN(protoPriv._requiredLevelAlignment,
                                 levelOffsetWrite);
    return KTX_SUCCESS;
}